

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O0

ValuedAction __thiscall despot::AEMS::Search(AEMS *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  VNode *pVVar4;
  undefined4 extraout_var;
  clock_t cVar5;
  size_t sVar6;
  clock_t cVar7;
  clock_t cVar8;
  log_ostream *plVar9;
  ostream *poVar10;
  double dVar11;
  double dVar12;
  ValuedAction VVar13;
  clock_t start;
  int hist_size;
  VNode *promising_node;
  int num_active_particles;
  clock_t begin;
  AEMS *local_20;
  AEMS *this_local;
  ValuedAction astar;
  
  local_20 = this;
  if (this->root_ == (VNode *)0x0) {
    pVVar4 = (VNode *)operator_new(0x98);
    iVar2 = (*((this->super_Solver).belief_)->_vptr_Belief[5])();
    VNode::VNode(pVVar4,(Belief *)CONCAT44(extraout_var,iVar2),0,(QNode *)0x0,0xffffffffffffffff);
    this->root_ = pVVar4;
    InitLowerBound(this->root_,this->lower_bound_,&(this->super_Solver).history_);
    InitUpperBound(this->root_,this->upper_bound_,&(this->super_Solver).history_);
  }
  SearchStatistics::SearchStatistics((SearchStatistics *)&begin);
  memcpy(&this->statistics_,&begin,0x60);
  iVar2 = (*(this->model_->super_DSPOMDP)._vptr_DSPOMDP[0x18])();
  (this->statistics_).num_particles_before_search = iVar2;
  (*(this->model_->super_DSPOMDP)._vptr_DSPOMDP[0x14])
            (this->model_,(this->super_Solver).belief_,&std::cout);
  cVar5 = clock();
  dVar11 = VNode::lower_bound(this->root_);
  (this->statistics_).initial_lb = dVar11;
  dVar11 = VNode::upper_bound(this->root_);
  (this->statistics_).initial_ub = dVar11;
  iVar2 = (*(this->model_->super_DSPOMDP)._vptr_DSPOMDP[0x18])();
  do {
    pVVar4 = FindMaxApproxErrorLeaf(this->root_);
    bVar1 = VNode::IsLeaf(pVVar4);
    if (!bVar1) {
      __assert_fail("promising_node->IsLeaf()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/solver/aems.cpp"
                    ,0x24,"virtual ValuedAction despot::AEMS::Search()");
    }
    sVar6 = History::Size(&(this->super_Solver).history_);
    cVar7 = clock();
    Expand(pVVar4,this->lower_bound_,this->upper_bound_,this->model_,&(this->super_Solver).history_)
    ;
    cVar8 = clock();
    (this->statistics_).time_node_expansion =
         (double)((cVar8 - cVar7) / 1000000) + (this->statistics_).time_node_expansion;
    Backup(pVVar4);
    History::Truncate(&(this->super_Solver).history_,(int)sVar6);
    iVar3 = VNode::depth(pVVar4);
    if ((this->statistics_).longest_trial_length < iVar3) {
      iVar3 = VNode::depth(pVVar4);
      (this->statistics_).longest_trial_length = iVar3;
    }
    (this->statistics_).num_trials = (this->statistics_).num_trials + 1;
    (this->statistics_).num_expanded_nodes = (this->statistics_).num_expanded_nodes + 1;
    cVar7 = clock();
    bVar1 = false;
    if ((double)(cVar7 - cVar5) / 1000000.0 < Globals::config) {
      dVar11 = VNode::upper_bound(this->root_);
      dVar12 = VNode::lower_bound(this->root_);
      bVar1 = 1e-06 < dVar11 - dVar12;
    }
  } while (bVar1);
  iVar3 = (*(this->model_->super_DSPOMDP)._vptr_DSPOMDP[0x18])();
  (this->statistics_).num_tree_particles = iVar3 - iVar2;
  iVar2 = VNode::Size(this->root_);
  (this->statistics_).num_tree_nodes = iVar2;
  iVar2 = VNode::PolicyTreeSize(this->root_);
  (this->statistics_).num_policy_nodes = iVar2;
  iVar2 = (*(this->model_->super_DSPOMDP)._vptr_DSPOMDP[0x18])();
  (this->statistics_).num_particles_after_search = iVar2;
  dVar11 = VNode::lower_bound(this->root_);
  (this->statistics_).final_lb = dVar11;
  dVar11 = VNode::upper_bound(this->root_);
  (this->statistics_).final_ub = dVar11;
  cVar7 = clock();
  (this->statistics_).time_search = (double)(cVar7 - cVar5) / 1000000.0;
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
    plVar9 = logging::stream(3);
    poVar10 = std::operator<<(&plVar9->super_ostream,"[AEMS::Search]");
    poVar10 = despot::operator<<(poVar10,&this->statistics_);
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  }
  VVar13 = OptimalAction(this->root_);
  VVar13._4_4_ = 0;
  return VVar13;
}

Assistant:

ValuedAction AEMS::Search() {
	if (root_ == NULL) {
		root_ = new VNode(belief_->MakeCopy());
		InitLowerBound(root_, lower_bound_, history_);
		InitUpperBound(root_, upper_bound_, history_);
	}

	statistics_ = SearchStatistics();
	statistics_.num_particles_before_search = model_->NumActiveParticles();

	model_->PrintBelief(*belief_); //TODO: check and remove
	// cout << *belief_ << endl;
	clock_t begin = clock();
	statistics_.initial_lb = root_->lower_bound();
	statistics_.initial_ub = root_->upper_bound();

	int num_active_particles = model_->NumActiveParticles();
	do {
		VNode* promising_node = FindMaxApproxErrorLeaf(root_);
		assert(promising_node->IsLeaf());

		int hist_size = history_.Size();
		clock_t start = clock();
		Expand(promising_node, lower_bound_, upper_bound_, model_, history_);
		statistics_.time_node_expansion += (clock() - start) / CLOCKS_PER_SEC;
		Backup(promising_node);
		history_.Truncate(hist_size);

		if (promising_node->depth() > statistics_.longest_trial_length) {
			statistics_.longest_trial_length = promising_node->depth();
		}

		statistics_.num_trials++;
		statistics_.num_expanded_nodes++;
	} while ((double) (clock() - begin) / CLOCKS_PER_SEC
		< Globals::config.time_per_move
		&& (root_->upper_bound() - root_->lower_bound()) > 1e-6);

	statistics_.num_tree_particles = model_->NumActiveParticles()
		- num_active_particles;
	statistics_.num_tree_nodes = root_->Size();
	statistics_.num_policy_nodes = root_->PolicyTreeSize();
	statistics_.num_particles_after_search = model_->NumActiveParticles();

	statistics_.final_lb = root_->lower_bound();
	statistics_.final_ub = root_->upper_bound();
	statistics_.time_search = (double) (clock() - begin) / CLOCKS_PER_SEC;

	logi << "[AEMS::Search]" << statistics_ << endl;

	ValuedAction astar = OptimalAction(root_);
	//delete root_;
	return astar;
}